

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O3

bool __thiscall
cmFileListGeneratorGlob::Search(cmFileListGeneratorGlob *this,string *parent,cmFileList *lister)

{
  pointer pcVar1;
  bool bVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  pointer inName;
  string expr;
  Glob g;
  string local_a0;
  Glob local_80;
  
  pcVar1 = (parent->_M_dataplus)._M_p;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,pcVar1,pcVar1 + parent->_M_string_length);
  std::__cxx11::string::_M_append((char *)&local_a0,(ulong)(this->Pattern)._M_dataplus._M_p);
  cmsys::Glob::Glob(&local_80);
  bVar2 = cmsys::Glob::FindFiles(&local_80,&local_a0,(GlobMessages *)0x0);
  if (bVar2) {
    pvVar3 = cmsys::Glob::GetFiles_abi_cxx11_(&local_80);
    for (inName = (pvVar3->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        inName != (pvVar3->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish; inName = inName + 1) {
      bVar2 = cmsys::SystemTools::FileIsDirectory(inName);
      if (bVar2) {
        bVar2 = cmFileListGeneratorBase::Consider
                          (&this->super_cmFileListGeneratorBase,inName,lister);
        if (bVar2) {
          bVar2 = true;
          goto LAB_003c90b4;
        }
      }
    }
  }
  bVar2 = false;
LAB_003c90b4:
  cmsys::Glob::~Glob(&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

virtual bool Search(std::string const& parent, cmFileList& lister)
    {
    // Glob the set of matching files.
    std::string expr = parent;
    expr += this->Pattern;
    cmsys::Glob g;
    if(!g.FindFiles(expr))
      {
      return false;
      }
    std::vector<std::string> const& files = g.GetFiles();

    // Look for directories among the matches.
    for(std::vector<std::string>::const_iterator fi = files.begin();
        fi != files.end(); ++fi)
      {
      if(cmSystemTools::FileIsDirectory(*fi))
        {
        if(this->Consider(*fi, lister))
          {
          return true;
          }
        }
      }
    return false;
    }